

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getDualSol(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_vector)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint *puVar3;
  Status SVar4;
  pointer pnVar5;
  pointer pnVar6;
  DataKey DVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  Status SVar12;
  ulong uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  DataKey local_58;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (this->initialized != false) {
    if (this->theRep == ROW) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(p_vector,&(this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object);
      uVar13 = (ulong)(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
      if (0 < (long)uVar13) {
        uVar15 = uVar13 + 1;
        lVar16 = ~uVar13 + uVar13 * 8;
        do {
          DVar7 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).theBaseId.data[uVar15 - 2].super_DataKey;
          if (DVar7.info < 0) {
            pnVar5 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_58 = DVar7;
            SPxRowId::SPxRowId((SPxRowId *)&local_50,(SPxId *)&local_58);
            iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,&local_50);
            pnVar6 = (p_vector->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&pnVar5->m_backend + lVar16 * 8 + -0x30);
            uVar8 = *(undefined8 *)(puVar2 + 2);
            puVar3 = (uint *)((long)&pnVar5->m_backend + lVar16 * 8 + -0x20);
            uVar9 = *(undefined8 *)puVar3;
            uVar10 = *(undefined8 *)(puVar3 + 2);
            *(undefined8 *)&pnVar6[iVar11].m_backend.data = *(undefined8 *)puVar2;
            *(undefined8 *)((long)&pnVar6[iVar11].m_backend.data + 8) = uVar8;
            puVar2 = (uint *)((long)&pnVar6[iVar11].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = uVar9;
            *(undefined8 *)(puVar2 + 2) = uVar10;
            *(undefined8 *)((long)&pnVar6[iVar11].m_backend.data + 0x20) =
                 *(undefined8 *)((long)&pnVar5->m_backend + lVar16 * 8 + -0x10);
            pnVar6[iVar11].m_backend.exp =
                 *(fpclass_type *)((long)&pnVar5->m_backend + lVar16 * 8 + -8);
            pnVar6[iVar11].m_backend.neg =
                 SUB41(*(int32_t *)((long)&pnVar5->m_backend + lVar16 * 8 + -4),0);
            uVar8 = *(undefined8 *)((long)&pnVar5->m_backend + lVar16 * 8);
            pnVar6[iVar11].m_backend.fpclass = (int)uVar8;
            pnVar6[iVar11].m_backend.prec_elem = (int)((ulong)uVar8 >> 0x20);
          }
          uVar15 = uVar15 - 1;
          lVar16 = lVar16 + -7;
        } while (1 < uVar15);
      }
    }
    else if (0 < (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        SVar4 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar16];
        if (((uint)SVar4 < 9) && ((0x156U >> (SVar4 & 0x1f) & 1) != 0)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     ((long)&(((p_vector->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar17)
                     ,0);
        }
        else {
          pnVar5 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar6 = (p_vector->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar17 + 0x20) =
               *(undefined8 *)((long)&pnVar5->m_backend + lVar17 + 0x20);
          puVar14 = (undefined8 *)((long)&pnVar5->m_backend + lVar17);
          uVar8 = *puVar14;
          uVar9 = puVar14[1];
          puVar14 = (undefined8 *)((long)&pnVar5->m_backend + lVar17 + 0x10);
          uVar10 = puVar14[1];
          puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar17 + 0x10);
          *puVar1 = *puVar14;
          puVar1[1] = uVar10;
          puVar14 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar17);
          *puVar14 = uVar8;
          puVar14[1] = uVar9;
          *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar17 + 0x28) =
               *(undefined4 *)((long)&pnVar5->m_backend + lVar17 + 0x28);
          *(bool *)((long)&(pnVar6->m_backend).data + lVar17 + 0x2c) =
               *(bool *)((long)&pnVar5->m_backend + lVar17 + 0x2c);
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar17 + 0x30) =
               *(undefined8 *)((long)&pnVar5->m_backend + lVar17 + 0x30);
        }
        lVar16 = lVar16 + 1;
        lVar17 = lVar17 + 0x38;
      } while (lVar16 < (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    local_50 = (DataKey)(double)(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesense;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)p_vector,(double *)&local_50);
    SVar12 = status(this);
    return SVar12;
  }
  SVar12 = status(this);
  if (SVar12 != NO_PROBLEM) {
    puVar14 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_50 = (DataKey)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XSOLVE08 No Problem loaded","");
    *puVar14 = &PTR__SPxException_003adbd8;
    puVar14[1] = puVar14 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar14 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
    *puVar14 = &PTR__SPxException_003aea68;
    __cxa_throw(puVar14,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  SVar12 = status(this);
  return SVar12;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE08 No Problem loaded");
   }

   if(rep() == ROW)
   {
      int i;
      p_vector = this->maxRowObj();

      for(i = this->nCols() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = fVec()[i];
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nRows(); ++i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = (*theCoPvec)[i];
         }
      }
   }

   p_vector *= Real(this->spxSense());

   return status();
}